

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcPresentationStyle::~IfcPresentationStyle(IfcPresentationStyle *this)

{
  ~IfcPresentationStyle
            ((IfcPresentationStyle *)
             ((long)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyle,_1UL>).
                     _vptr_ObjectHelper +
             (long)(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyle,_1UL>).
                   _vptr_ObjectHelper[-3]));
  return;
}

Assistant:

IfcPresentationStyle() : Object("IfcPresentationStyle") {}